

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ConcurrentDatabase::write_entry
          (ConcurrentDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t blob_size,
          PayloadWriteFlags flags)

{
  long *plVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  const_iterator cVar5;
  undefined8 *puVar6;
  long *plVar7;
  DatabaseInterface *pDVar8;
  bool *pbVar9;
  char cVar10;
  ulong uVar11;
  DatabaseInterface *pDVar12;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string write_path;
  Hash local_d0;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  bool *local_a8;
  void *local_a0;
  size_t local_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if (OverWrite < this->mode) {
    return (bool)0;
  }
  if (this->mode == ReadOnly) {
    return (bool)0;
  }
  local_d0 = hash;
  cVar5 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this->primed_hashes[tag]._M_h,&local_d0);
  if (cVar5.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
    return (bool)1;
  }
  pDVar12 = (this->readonly_interface)._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar12 != (DatabaseInterface *)0x0) &&
     (iVar4 = (*pDVar12->_vptr_DatabaseInterface[5])(pDVar12,(ulong)tag,local_d0),
     (char)iVar4 != '\0')) {
    return (bool)1;
  }
  pDVar12 = (this->writeonly_interface)._M_t.
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar12 == (DatabaseInterface *)0x0) {
    if (this->need_writeonly_database == false) {
      return (bool)0;
    }
LAB_00153331:
    local_a8 = &this->need_writeonly_database;
    __val = 1;
    local_a0 = blob;
    local_98 = blob_size;
    do {
      pcVar3 = (this->base_path)._M_dataplus._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (this->base_path)._M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      cVar10 = '\x03' - (__val < 100);
      if (__val < 10) {
        cVar10 = '\x01';
      }
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,local_88,__val);
      uVar11 = 0xf;
      if (local_70 != local_60) {
        uVar11 = local_60[0];
      }
      uVar2 = CONCAT44(uStack_84,local_88) + local_68;
      if (uVar11 < uVar2) {
        uVar11 = 0xf;
        if (local_90 != local_80) {
          uVar11 = local_80[0];
        }
        if (uVar11 < uVar2) goto LAB_0015340a;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_0015340a:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
      }
      local_c8 = &local_b8;
      plVar1 = puVar6 + 2;
      if ((long *)*puVar6 == plVar1) {
        local_b8 = *plVar1;
        uStack_b0 = puVar6[3];
      }
      else {
        local_b8 = *plVar1;
        local_c8 = (long *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = plVar1;
      puVar6[1] = 0;
      *(undefined1 *)plVar1 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      plVar1 = plVar7 + 2;
      if ((long *)*plVar7 == plVar1) {
        local_40 = *plVar1;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar1;
        local_50 = (long *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)plVar1;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      pDVar8 = create_stream_archive_database((char *)local_50,ExclusiveOverWrite);
      pDVar12 = (this->writeonly_interface)._M_t.
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (this->writeonly_interface)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar8;
      if (pDVar12 != (DatabaseInterface *)0x0) {
        (*pDVar12->_vptr_DatabaseInterface[1])();
        pDVar8 = (this->writeonly_interface)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      }
      iVar4 = (*pDVar8->_vptr_DatabaseInterface[2])(pDVar8);
      if ((char)iVar4 == '\0') {
        pDVar12 = (this->writeonly_interface)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->writeonly_interface)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
             (DatabaseInterface *)0x0;
        if (pDVar12 != (DatabaseInterface *)0x0) {
          (*pDVar12->_vptr_DatabaseInterface[1])();
        }
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      pDVar12 = (this->writeonly_interface)._M_t.
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      pbVar9 = local_a8;
      blob_size = local_98;
      blob = local_a0;
    } while ((__val < 0xff) && (__val = __val + 1, pDVar12 == (DatabaseInterface *)0x0));
  }
  else {
    iVar4 = (*pDVar12->_vptr_DatabaseInterface[5])(pDVar12,(ulong)tag,local_d0);
    if ((char)iVar4 != '\0') {
      return (bool)1;
    }
    pDVar12 = (this->writeonly_interface)._M_t.
              super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ._M_t.
              super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
              .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (this->need_writeonly_database == false) goto LAB_001535c5;
    pbVar9 = &this->need_writeonly_database;
    if (pDVar12 == (DatabaseInterface *)0x0) goto LAB_00153331;
  }
  *pbVar9 = false;
LAB_001535c5:
  if (pDVar12 == (DatabaseInterface *)0x0) {
    return false;
  }
  iVar4 = (*pDVar12->_vptr_DatabaseInterface[4])
                    (pDVar12,(ulong)tag,local_d0,blob,blob_size,(ulong)flags);
  return (bool)(char)iVar4;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t blob_size, PayloadWriteFlags flags) override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		if (writeonly_interface && writeonly_interface->has_entry(tag, hash))
			return true;

		if (need_writeonly_database)
		{
			// Lazily create a new database. Open the database file exclusively to work concurrently with other processes.
			// Don't try forever.
			for (unsigned index = 1; index < 256 && !writeonly_interface; index++)
			{
				std::string write_path = base_path + "." + std::to_string(index) + ".foz";
				writeonly_interface.reset(create_stream_archive_database(write_path.c_str(), DatabaseMode::ExclusiveOverWrite));
				if (!writeonly_interface->prepare())
					writeonly_interface.reset();
			}

			need_writeonly_database = false;
		}

		if (writeonly_interface)
			return writeonly_interface->write_entry(tag, hash, blob, blob_size, flags);
		else
			return false;
	}